

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticClient.cpp
# Opt level: O0

string_view __thiscall
slang::DiagnosticClient::getSourceLine(DiagnosticClient *this,SourceLocation location,size_t col)

{
  bool bVar1;
  const_pointer pvVar2;
  size_t sVar3;
  char *__str;
  size_type sVar4;
  SourceManager *in_RDX;
  long in_RDI;
  char *end;
  char *curr;
  char *start;
  string_view text;
  SourceLocation *in_stack_ffffffffffffff98;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  char *local_50;
  string_view local_38;
  SourceLocation local_18;
  string_view local_10;
  
  this_00 = *(basic_string_view<char,_std::char_traits<char>_> **)(in_RDI + 0x10);
  SourceLocation::buffer(in_stack_ffffffffffffff98);
  local_38 = SourceManager::getSourceText(in_RDX,(BufferID)(uint32_t)((ulong)in_RDI >> 0x20));
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_38);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_00,(char *)in_stack_ffffffffffffff98);
  }
  else {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_38);
    sVar3 = SourceLocation::offset(&local_18);
    __str = pvVar2 + (sVar3 - (long)&in_RDX[-1].field_0x14f);
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_38);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_38);
    local_50 = __str;
    while( true ) {
      bVar1 = false;
      if ((local_50 != pvVar2 + (sVar4 - 1)) && (bVar1 = false, *local_50 != '\n')) {
        bVar1 = *local_50 != '\r';
      }
      if (!bVar1) break;
      local_50 = local_50 + 1;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_10,__str,(long)local_50 - (long)__str);
  }
  return local_10;
}

Assistant:

std::string_view DiagnosticClient::getSourceLine(SourceLocation location, size_t col) const {
    std::string_view text = sourceManager->getSourceText(location.buffer());
    if (text.empty())
        return "";

    const char* start = text.data() + location.offset() - (col - 1);
    const char* curr = start;
    const char* end = text.data() + text.size() - 1;
    while (curr != end && *curr != '\n' && *curr != '\r')
        curr++;

    return std::string_view(start, (size_t)(curr - start));
}